

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O3

char * wabt::GetTokenTypeName(TokenType token_type)

{
  if ((int)token_type < 0x84) {
    return GetTokenTypeName::s_names[(int)token_type];
  }
  return "Invalid";
}

Assistant:

const char* GetTokenTypeName(TokenType token_type) {
  static const char* s_names[] = {
#define WABT_TOKEN(name, string) string,
#define WABT_TOKEN_FIRST(name, string)
#define WABT_TOKEN_LAST(name, string)
#include "wabt/token.def"
#undef WABT_TOKEN
#undef WABT_TOKEN_FIRST
#undef WABT_TOKEN_LAST
  };

  static_assert(
      WABT_ARRAY_SIZE(s_names) == WABT_ENUM_COUNT(TokenType),
      "Expected TokenType names list length to match number of TokenTypes.");

  int x = static_cast<int>(token_type);
  if (x < WABT_ENUM_COUNT(TokenType)) {
    return s_names[x];
  }

  return "Invalid";
}